

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetTargetVersion
          (cmGeneratorTarget *this,string *property,int *major,int *minor,int *patch)

{
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  undefined8 uVar4;
  undefined4 local_44;
  int local_40;
  int parsed_patch;
  int parsed_minor;
  int parsed_major;
  cmValue version;
  int *patch_local;
  int *minor_local;
  int *major_local;
  string *property_local;
  cmGeneratorTarget *this_local;
  
  *major = 0;
  *minor = 0;
  *patch = 0;
  version.Value = (string *)patch;
  TVar2 = GetType(this);
  if (TVar2 == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x195a,
                  "void cmGeneratorTarget::GetTargetVersion(const std::string &, int &, int &, int &) const"
                 );
  }
  _parsed_minor = GetProperty(this,property);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&parsed_minor);
  if (bVar1) {
    cmValue::operator->[abi_cxx11_((cmValue *)&parsed_minor);
    uVar4 = std::__cxx11::string::c_str();
    iVar3 = __isoc99_sscanf(uVar4,"%d.%d.%d",&parsed_patch,&local_40,&local_44);
    if (iVar3 != 1) {
      if (iVar3 != 2) {
        if (iVar3 != 3) {
          return;
        }
        *(undefined4 *)version.Value = local_44;
      }
      *minor = local_40;
    }
    *major = parsed_patch;
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetTargetVersion(const std::string& property,
                                         int& major, int& minor,
                                         int& patch) const
{
  // Set the default values.
  major = 0;
  minor = 0;
  patch = 0;

  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  if (cmValue version = this->GetProperty(property)) {
    // Try to parse the version number and store the results that were
    // successfully parsed.
    int parsed_major;
    int parsed_minor;
    int parsed_patch;
    switch (sscanf(version->c_str(), "%d.%d.%d", &parsed_major, &parsed_minor,
                   &parsed_patch)) {
      case 3:
        patch = parsed_patch;
        CM_FALLTHROUGH;
      case 2:
        minor = parsed_minor;
        CM_FALLTHROUGH;
      case 1:
        major = parsed_major;
        CM_FALLTHROUGH;
      default:
        break;
    }
  }
}